

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::write
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  basic_string_view<wchar_t> s;
  char *message;
  ssize_t extraout_RAX;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  basic_string_view<wchar_t> sv;
  size_t length;
  format_specs *in_stack_ffffffffffffffa8;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
  *in_stack_ffffffffffffffb0;
  basic_string_view<wchar_t> local_38;
  size_t local_28;
  wchar_t *local_10;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
  *local_8;
  
  local_10 = (wchar_t *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  if (local_10 == (wchar_t *)0x0) {
    message = (char *)__cxa_allocate_exception(0x10);
    format_error::format_error((format_error *)this,message);
    __cxa_throw(message,&format_error::typeinfo,format_error::~format_error);
  }
  local_28 = std::char_traits<wchar_t>::length((char_type_conflict *)0x179b1f);
  basic_string_view<wchar_t>::basic_string_view(&local_38,local_10,local_28);
  if (this->specs_ == (format_specs *)0x0) {
    sVar1 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
            write(&this->writer_,(int)local_38.data_,(void *)local_38.size_,__n);
  }
  else {
    s.size_ = local_38.size_;
    s.data_ = local_38.data_;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
    write<wchar_t>(in_stack_ffffffffffffffb0,s,in_stack_ffffffffffffffa8);
    sVar1 = extraout_RAX;
  }
  return sVar1;
}

Assistant:

void write(const char_type *value) {
    if (!value)
      FMT_THROW(format_error("string pointer is null"));
    auto length = std::char_traits<char_type>::length(value);
    basic_string_view<char_type> sv(value, length);
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }